

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O1

WJTL_STATUS
VerifyJsonParsesAsListOfListsOfNumbers
          (_Bool IsJson5,char *Json,size_t *SubListLengthArray,size_t SubListLengthArrayCount)

{
  JlDataObject *pJVar1;
  size_t sVar2;
  JL_STATUS JVar3;
  JL_DATA_TYPE JVar4;
  uint32_t uVar5;
  JL_STATUS JVar6;
  ulong uVar7;
  WJTL_STATUS WVar8;
  uint64_t uVar9;
  size_t *psVar10;
  JlDataObject *subListObject;
  JlDataObject *object;
  JlListItem *subEnumerator;
  JlListItem *enumerator;
  JlDataObject *listObject;
  uint64_t u64;
  size_t errorAtPos;
  JlDataObject *local_98;
  JlDataObject *local_90;
  ulong local_88;
  JlListItem *local_80;
  JlListItem *local_78;
  JlDataObject *local_70;
  JL_STATUS local_64;
  ulong local_60;
  uint64_t local_58;
  size_t *local_50;
  uint64_t local_48;
  JlDataObject *local_40;
  size_t local_38;
  
  local_70 = (JlDataObject *)0x0;
  local_38 = 100;
  local_78 = (JlListItem *)0x0;
  local_98 = (JlDataObject *)0x0;
  local_60 = SubListLengthArrayCount;
  local_50 = SubListLengthArray;
  JVar3 = JlParseJsonEx(Json,IsJson5,&local_70,&local_38);
  local_88 = CONCAT44(local_88._4_4_,JVar3);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x26f);
  pJVar1 = local_70;
  WjTestLib_Assert(local_70 != (JlDataObject *)0x0,"(listObject) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x270);
  JVar4 = JlGetObjectType(local_70);
  WjTestLib_Assert(JVar4 == JL_DATA_TYPE_LIST,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x271);
  sVar2 = local_38;
  WjTestLib_Assert(local_38 == 0,"errorAtPos == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x272);
  uVar5 = JlGetListCount(local_70);
  uVar7 = local_60;
  WVar8 = WJTL_STATUS_SUCCESS;
  if (uVar5 != local_60) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (sVar2 != 0) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (JVar4 != JL_DATA_TYPE_LIST) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (pJVar1 == (JlDataObject *)0x0) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if ((int)local_88 != 0) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(uVar5 == local_60,"JlGetListCount( listObject ) == SubListLengthArrayCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x274);
  local_78 = (JlListItem *)0x0;
  if (uVar7 != 0) {
    uVar9 = 0;
    uVar7 = 0;
    psVar10 = local_50;
    do {
      local_98 = (JlDataObject *)0x0;
      local_88 = uVar7;
      local_58 = uVar9;
      local_64 = JlGetObjectListNextItem(local_70,&local_98,&local_78);
      WjTestLib_Assert(local_64 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectListNextItem( listObject, &subListObject, &enumerator ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27b);
      local_40 = local_98;
      WjTestLib_Assert(local_98 != (JlDataObject *)0x0,"(subListObject) != NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27c);
      JVar4 = JlGetObjectType(local_98);
      WjTestLib_Assert(JVar4 == JL_DATA_TYPE_LIST,
                       "JlGetObjectType( subListObject ) == JL_DATA_TYPE_LIST",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27d);
      uVar5 = JlGetListCount(local_98);
      uVar7 = local_88;
      if (psVar10[local_88] != (ulong)uVar5) {
        WVar8 = WJTL_STATUS_FAILED;
      }
      if (JVar4 != JL_DATA_TYPE_LIST) {
        WVar8 = WJTL_STATUS_FAILED;
      }
      if (local_40 == (JlDataObject *)0x0) {
        WVar8 = WJTL_STATUS_FAILED;
      }
      if (local_64 != JL_STATUS_SUCCESS) {
        WVar8 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(psVar10[local_88] == (ulong)uVar5,
                       "JlGetListCount( subListObject ) == SubListLengthArray[i]",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27e);
      local_80 = (JlListItem *)0x0;
      local_90 = (JlDataObject *)0x0;
      uVar9 = local_58;
      if (psVar10[uVar7] != 0) {
        uVar7 = 0;
        do {
          local_48 = 0xffffffffffffffff;
          local_90 = (JlDataObject *)0x0;
          JVar3 = JlGetObjectListNextItem(local_98,&local_90,&local_80);
          WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                           "((JL_STATUS)(JlGetObjectListNextItem( subListObject, &object, &subEnumerator ))) == (JL_STATUS_SUCCESS)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsListOfListsOfNumbers",0x286);
          pJVar1 = local_90;
          WjTestLib_Assert(local_90 != (JlDataObject *)0x0,"(object) != NULL",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsListOfListsOfNumbers",0x287);
          JVar6 = JlGetObjectNumberU64(local_90,&local_48);
          psVar10 = local_50;
          if (JVar3 != JL_STATUS_SUCCESS || JVar6 != JL_STATUS_SUCCESS) {
            WVar8 = WJTL_STATUS_FAILED;
          }
          if (pJVar1 == (JlDataObject *)0x0) {
            WVar8 = WJTL_STATUS_FAILED;
          }
          WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                           "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsListOfListsOfNumbers",0x288);
          uVar9 = uVar9 + 1;
          if (uVar9 != local_48) {
            WVar8 = WJTL_STATUS_FAILED;
          }
          WjTestLib_Assert(uVar9 == local_48,"u64 == counter",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                           ,"VerifyJsonParsesAsListOfListsOfNumbers",0x28a);
          uVar7 = uVar7 + 1;
        } while (uVar7 < psVar10[local_88]);
      }
      JVar3 = JlGetObjectListNextItem(local_98,&local_90,&local_80);
      if (JVar3 != JL_STATUS_END_OF_DATA) {
        WVar8 = WJTL_STATUS_FAILED;
      }
      WjTestLib_Assert(JVar3 == JL_STATUS_END_OF_DATA,
                       "(JlGetObjectListNextItem( subListObject, &object, &subEnumerator )) == (JL_STATUS_END_OF_DATA)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x28e);
      uVar7 = local_88 + 1;
    } while (uVar7 != local_60);
  }
  JVar3 = JlGetObjectListNextItem(local_70,&local_98,&local_78);
  WjTestLib_Assert(JVar3 == JL_STATUS_END_OF_DATA,
                   "(JlGetObjectListNextItem( listObject, &subListObject, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x293);
  JVar6 = JlFreeObjectTree(&local_70);
  if (JVar6 != JL_STATUS_SUCCESS) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  if (JVar3 != JL_STATUS_END_OF_DATA) {
    WVar8 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x296);
  return WVar8;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfListsOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        size_t*         SubListLengthArray,
        size_t          SubListLengthArrayCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   subListObject = NULL;
    uint64_t        counter = 0;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( listObject );
    JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
    JL_ASSERT( errorAtPos == 0 );

    JL_ASSERT( JlGetListCount( listObject ) == SubListLengthArrayCount );

    // Verify all elements in list match array
    enumerator = NULL;
    for( size_t i=0; i<SubListLengthArrayCount; i++ )
    {
        subListObject = NULL;
        JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &subListObject, &enumerator ) );
        JL_ASSERT_NOT_NULL( subListObject );
        JL_ASSERT( JlGetObjectType( subListObject ) == JL_DATA_TYPE_LIST );
        JL_ASSERT( JlGetListCount( subListObject ) == SubListLengthArray[i] );

        JlListItem*     subEnumerator = NULL;
        JlDataObject*   object = NULL;
        for( size_t x=0; x<SubListLengthArray[i]; x++ )
        {
            uint64_t u64 = UINT64_MAX;
            object = NULL;
            JL_ASSERT_SUCCESS( JlGetObjectListNextItem( subListObject, &object, &subEnumerator ) );
            JL_ASSERT_NOT_NULL( object );
            JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
            counter += 1;
            JL_ASSERT( u64 == counter );
        }

        // Verify there are no more items in the list
        JL_ASSERT_STATUS( JlGetObjectListNextItem( subListObject, &object, &subEnumerator ), JL_STATUS_END_OF_DATA );

    }

    // Verify there are no more items in the list
    JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &subListObject, &enumerator ), JL_STATUS_END_OF_DATA );

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );

    return TestReturn;
}